

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

char * mpack_read_bytes_inplace_notrack(mpack_reader_t *reader,size_t count)

{
  _Bool _Var1;
  char *pcVar2;
  
  if (reader->error != mpack_ok) {
    return (char *)0x0;
  }
  pcVar2 = reader->data;
  if ((ulong)((long)reader->end - (long)pcVar2) < count) {
    _Var1 = mpack_reader_ensure_straddle(reader,count);
    if (!_Var1) {
      return (char *)0x0;
    }
    pcVar2 = reader->data;
  }
  reader->data = pcVar2 + count;
  return pcVar2;
}

Assistant:

static const char* mpack_read_bytes_inplace_notrack(mpack_reader_t* reader, size_t count) {
    if (mpack_reader_error(reader) != mpack_ok)
        return NULL;

    // if we have enough bytes already in the buffer, we can return it directly.
    if ((size_t)(reader->end - reader->data) >= count) {
        const char* bytes = reader->data;
        reader->data += count;
        return bytes;
    }

    if (!mpack_reader_ensure(reader, count))
        return NULL;

    const char* bytes = reader->data;
    reader->data += count;
    return bytes;
}